

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lights.cpp
# Opt level: O0

Float __thiscall pbrt::LightBounds::Importance(LightBounds *this,Point3f p,Normal3f n)

{
  undefined8 uVar1;
  Point3<float> p_00;
  Normal3<float> n_00;
  Vector3<float> v;
  Point3<float> p2;
  Normal3<float> c;
  Vector3<float> v_00;
  Point3<float> p1;
  Vector3<float> w;
  Point3f p_01;
  bool bVar2;
  float *pfVar3;
  int __x;
  Normal3<float> *in_RDI;
  type tVar4;
  float sinTheta_a;
  float fVar5;
  float fVar6;
  Float FVar7;
  Float sinTheta_a_00;
  type v_01;
  undefined1 in_ZMM0 [64];
  undefined1 auVar14 [56];
  undefined1 auVar9 [64];
  undefined1 extraout_var [56];
  undefined1 auVar11 [64];
  undefined1 auVar12 [64];
  undefined1 auVar13 [64];
  undefined4 in_XMM1_Da;
  undefined1 auVar16 [56];
  undefined1 auVar15 [64];
  undefined1 in_ZMM2 [64];
  float in_XMM3_Da;
  Point3<float> PVar17;
  Vector3<float> VVar18;
  DirectionCone DVar19;
  Float cosThetap_i;
  Float sinTheta_i;
  Float cosTheta_i;
  Float importance;
  Float cosThetap;
  Float sinTheta_x;
  Float cosTheta_x;
  Float sinTheta_o;
  Float sinTheta_b;
  Float cosTheta_b;
  Float sinTheta_w;
  Float cosTheta_w;
  Vector3f wi;
  anon_class_1_0_00000001 sinSubClamped;
  anon_class_1_0_00000001 cosSubClamped;
  Float d2;
  Point3f pc;
  float in_stack_fffffffffffffd68;
  float in_stack_fffffffffffffd6c;
  undefined4 in_stack_fffffffffffffd78;
  float in_stack_fffffffffffffd7c;
  undefined4 in_stack_fffffffffffffd80;
  undefined4 in_stack_fffffffffffffd84;
  undefined4 in_stack_fffffffffffffd90;
  undefined4 in_stack_fffffffffffffd94;
  float in_stack_fffffffffffffd98;
  undefined4 in_stack_fffffffffffffd9c;
  float in_stack_fffffffffffffda0;
  undefined4 in_stack_fffffffffffffda4;
  float in_stack_fffffffffffffdb4;
  undefined8 in_stack_fffffffffffffdb8;
  float in_stack_fffffffffffffdc0;
  undefined8 in_stack_fffffffffffffdc8;
  float in_stack_fffffffffffffdd0;
  undefined8 local_224;
  float local_21c;
  float in_stack_fffffffffffffde8;
  undefined4 in_stack_fffffffffffffdec;
  float in_stack_fffffffffffffdf0;
  float fStack_1d4;
  float local_18c;
  undefined4 in_stack_fffffffffffffea4;
  undefined8 uVar20;
  anon_class_1_0_00000001 local_11a;
  anon_class_1_0_00000001 local_119;
  undefined8 local_118;
  float local_110;
  undefined8 local_108;
  float local_100;
  undefined8 local_f8;
  float local_f0;
  float local_ec;
  undefined8 local_e8;
  float local_e0;
  undefined8 local_d8;
  undefined4 local_d0;
  undefined8 local_c8;
  float local_c0;
  undefined8 local_b8;
  undefined4 local_b0;
  float local_ac;
  undefined8 local_a8;
  float local_a0;
  undefined8 local_98;
  float local_90;
  undefined8 local_88;
  float local_80;
  undefined8 local_78;
  float local_70;
  undefined8 local_68;
  float local_60;
  undefined8 local_58;
  float local_50;
  Tuple3<pbrt::Normal3,_float> local_40;
  Tuple3<pbrt::Normal3,_float> local_30;
  undefined8 local_20;
  undefined8 local_10;
  undefined4 local_8;
  float local_4;
  undefined1 auVar8 [64];
  undefined1 auVar10 [64];
  
  local_20 = vmovlpd_avx(in_ZMM0._0_16_);
  local_40._0_8_ = vmovlpd_avx(in_ZMM2._0_16_);
  local_80 = in_RDI[1].super_Tuple3<pbrt::Normal3,_float>.z;
  local_88._0_4_ = in_RDI[1].super_Tuple3<pbrt::Normal3,_float>.x;
  local_88._4_4_ = in_RDI[1].super_Tuple3<pbrt::Normal3,_float>.y;
  auVar14 = ZEXT856(0);
  PVar17.super_Tuple3<pbrt::Point3,_float>.y = (float)in_stack_fffffffffffffd94;
  PVar17.super_Tuple3<pbrt::Point3,_float>.x = (float)in_stack_fffffffffffffd90;
  PVar17.super_Tuple3<pbrt::Point3,_float>.z = in_stack_fffffffffffffd98;
  local_78 = local_88;
  local_70 = local_80;
  local_30._0_8_ = local_40._0_8_;
  local_30.z = in_XMM3_Da;
  local_10 = local_20;
  local_8 = in_XMM1_Da;
  PVar17 = Tuple3<pbrt::Point3,float>::operator+
                     ((Tuple3<pbrt::Point3,_float> *)
                      CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78),PVar17);
  local_90 = PVar17.super_Tuple3<pbrt::Point3,_float>.z;
  auVar8._0_8_ = PVar17.super_Tuple3<pbrt::Point3,_float>._0_8_;
  auVar8._8_56_ = auVar14;
  local_98 = vmovlpd_avx(auVar8._0_16_);
  local_68 = local_98;
  local_60 = local_90;
  PVar17 = Tuple3<pbrt::Point3,float>::operator/
                     ((Tuple3<pbrt::Point3,_float> *)
                      CONCAT44(in_stack_fffffffffffffd84,in_stack_fffffffffffffd80),
                      (int)in_stack_fffffffffffffd7c);
  local_e0 = PVar17.super_Tuple3<pbrt::Point3,_float>.z;
  auVar9._0_8_ = PVar17.super_Tuple3<pbrt::Point3,_float>._0_8_;
  auVar9._8_56_ = auVar14;
  local_e8 = vmovlpd_avx(auVar9._0_16_);
  local_b0 = local_8;
  local_b8 = local_10;
  local_d0 = local_8;
  local_d8 = local_10;
  p1.super_Tuple3<pbrt::Point3,_float>.y = (float)in_stack_fffffffffffffdec;
  p1.super_Tuple3<pbrt::Point3,_float>.x = in_stack_fffffffffffffde8;
  p1.super_Tuple3<pbrt::Point3,_float>.z = in_stack_fffffffffffffdf0;
  p2.super_Tuple3<pbrt::Point3,_float>.z = in_stack_fffffffffffffdd0;
  p2.super_Tuple3<pbrt::Point3,_float>.x = (float)(int)in_stack_fffffffffffffdc8;
  p2.super_Tuple3<pbrt::Point3,_float>.y = (float)(int)((ulong)in_stack_fffffffffffffdc8 >> 0x20);
  local_c8 = local_e8;
  local_c0 = local_e0;
  local_a8 = local_e8;
  local_a0 = local_e0;
  local_58 = local_e8;
  local_50 = local_e0;
  local_ac = DistanceSquared<float>(p1,p2);
  auVar14 = extraout_var;
  VVar18 = Bounds3<float>::Diagonal
                     ((Bounds3<float> *)
                      CONCAT44(in_stack_fffffffffffffda4,in_stack_fffffffffffffda0));
  local_110 = VVar18.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar10._0_8_ = VVar18.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar10._8_56_ = auVar14;
  local_118 = vmovlpd_avx(auVar10._0_16_);
  VVar18.super_Tuple3<pbrt::Vector3,_float>.y = (float)in_stack_fffffffffffffd9c;
  VVar18.super_Tuple3<pbrt::Vector3,_float>.x = in_stack_fffffffffffffd98;
  VVar18.super_Tuple3<pbrt::Vector3,_float>.z = in_stack_fffffffffffffda0;
  local_108 = local_118;
  local_100 = local_110;
  local_f8 = local_118;
  local_f0 = local_110;
  tVar4 = Length<float>(VVar18);
  local_ec = tVar4 * 0.5;
  pfVar3 = std::max<float>(&local_ac,&local_ec);
  local_ac = *pfVar3;
  auVar14 = ZEXT856(0);
  __x = (int)&local_10;
  p_00.super_Tuple3<pbrt::Point3,_float>.y = (float)in_stack_fffffffffffffd94;
  p_00.super_Tuple3<pbrt::Point3,_float>.x = (float)in_stack_fffffffffffffd90;
  p_00.super_Tuple3<pbrt::Point3,_float>.z = in_stack_fffffffffffffd98;
  uVar20 = local_58;
  fVar5 = local_50;
  VVar18 = Point3<float>::operator-
                     ((Point3<float> *)CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78)
                      ,p_00);
  fVar6 = VVar18.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar11._0_8_ = VVar18.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar11._8_56_ = auVar14;
  vmovlpd_avx(auVar11._0_16_);
  auVar14 = ZEXT856(0);
  v.super_Tuple3<pbrt::Vector3,_float>.z = in_stack_fffffffffffffdc0;
  v.super_Tuple3<pbrt::Vector3,_float>.x = (float)(int)in_stack_fffffffffffffdb8;
  v.super_Tuple3<pbrt::Vector3,_float>.y = (float)(int)((ulong)in_stack_fffffffffffffdb8 >> 0x20);
  VVar18 = Normalize<float>(v);
  auVar12._0_8_ = VVar18.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar12._8_56_ = auVar14;
  uVar1 = vmovlpd_avx(auVar12._0_16_);
  w.super_Tuple3<pbrt::Vector3,_float>.z = VVar18.super_Tuple3<pbrt::Vector3,_float>.z;
  w.super_Tuple3<pbrt::Vector3,_float>.x = (float)(int)uVar1;
  w.super_Tuple3<pbrt::Vector3,_float>.y = (float)(int)((ulong)uVar1 >> 0x20);
  local_18c = Dot<float>((Vector3<float>)
                         *(Tuple3<pbrt::Vector3,_float> *)
                          &in_RDI[2].super_Tuple3<pbrt::Normal3,_float>.y,w);
  if (((uint)in_RDI[4].super_Tuple3<pbrt::Normal3,_float>.x & 1) != 0) {
    std::abs(__x);
  }
  Sqr<float>(local_18c);
  sinTheta_a = SafeSqrt(0.0);
  auVar14 = ZEXT856(0);
  auVar16 = (undefined1  [56])0x0;
  p_01.super_Tuple3<pbrt::Point3,_float>.z = fVar5;
  p_01.super_Tuple3<pbrt::Point3,_float>.x = (float)(int)uVar20;
  p_01.super_Tuple3<pbrt::Point3,_float>.y = (float)(int)((ulong)uVar20 >> 0x20);
  DVar19 = BoundSubtendedDirections((Bounds3f *)CONCAT44(in_stack_fffffffffffffea4,fVar6),p_01);
  auVar15._0_8_ = DVar19._8_8_;
  auVar15._8_56_ = auVar16;
  auVar13._0_8_ = DVar19.w.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar13._8_56_ = auVar14;
  vmovlpd_avx(auVar13._0_16_);
  uVar1 = vmovlpd_avx(auVar15._0_16_);
  fStack_1d4 = (float)((ulong)uVar1 >> 0x20);
  Sqr<float>(fStack_1d4);
  fVar5 = SafeSqrt(0.0);
  Sqr<float>(in_RDI[3].super_Tuple3<pbrt::Normal3,_float>.y);
  fVar6 = SafeSqrt(0.0);
  FVar7 = Importance::anon_class_1_0_00000001::operator()
                    (&local_119,sinTheta_a,local_18c,fVar6,
                     in_RDI[3].super_Tuple3<pbrt::Normal3,_float>.y);
  sinTheta_a_00 =
       Importance::anon_class_1_0_00000001::operator()
                 (&local_11a,sinTheta_a,local_18c,fVar6,
                  in_RDI[3].super_Tuple3<pbrt::Normal3,_float>.y);
  FVar7 = Importance::anon_class_1_0_00000001::operator()
                    (&local_119,sinTheta_a_00,FVar7,fVar5,fStack_1d4);
  if (in_RDI[3].super_Tuple3<pbrt::Normal3,_float>.z < FVar7) {
    Normal3<float>::Normal3(in_RDI,in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68,0.0);
    c.super_Tuple3<pbrt::Normal3,_float>.z = local_21c;
    c.super_Tuple3<pbrt::Normal3,_float>._0_8_ = local_224;
    bVar2 = Tuple3<pbrt::Normal3,_float>::operator!=(&local_30,c);
    if (bVar2) {
      v_00.super_Tuple3<pbrt::Vector3,_float>.z = local_21c;
      v_00.super_Tuple3<pbrt::Vector3,_float>.x = (float)(int)local_224;
      v_00.super_Tuple3<pbrt::Vector3,_float>.y = (float)(int)((ulong)local_224 >> 0x20);
      n_00.super_Tuple3<pbrt::Normal3,_float>.y = local_30.z;
      n_00.super_Tuple3<pbrt::Normal3,_float>.x = local_30.y;
      n_00.super_Tuple3<pbrt::Normal3,_float>.z = in_stack_fffffffffffffdb4;
      v_01 = AbsDot<float>(v_00,n_00);
      Sqr<float>(v_01);
      fVar6 = SafeSqrt(0.0);
      Importance::anon_class_1_0_00000001::operator()(&local_119,fVar6,v_01,fVar5,fStack_1d4);
    }
    pfVar3 = std::max<float>((float *)&stack0xfffffffffffffde8,(float *)&stack0xfffffffffffffd7c);
    local_4 = *pfVar3;
  }
  else {
    local_4 = 0.0;
  }
  return local_4;
}

Assistant:

PBRT_CPU_GPU Float LightBounds::Importance(Point3f p, Normal3f n) const {
    // Return importance for light bounds at reference point
    // Compute clamped squared distance to reference point
    Point3f pc = (bounds.pMin + bounds.pMax) / 2;
    Float d2 = DistanceSquared(p, pc);
    d2 = std::max(d2, Length(bounds.Diagonal()) / 2);

    // Define cosine and sine clamped subtraction lambdas
    auto cosSubClamped = [](Float sinTheta_a, Float cosTheta_a, Float sinTheta_b,
                            Float cosTheta_b) -> Float {
        if (cosTheta_a > cosTheta_b)
            return 1;
        return cosTheta_a * cosTheta_b + sinTheta_a * sinTheta_b;
    };

    auto sinSubClamped = [](Float sinTheta_a, Float cosTheta_a, Float sinTheta_b,
                            Float cosTheta_b) -> Float {
        if (cosTheta_a > cosTheta_b)
            return 0;
        return sinTheta_a * cosTheta_b - cosTheta_a * sinTheta_b;
    };

    // Compute sine and cosine of angle to vector _w_, $\theta_\roman{w}$
    Vector3f wi = Normalize(p - pc);
    Float cosTheta_w = Dot(Vector3f(w), wi);
    if (twoSided)
        cosTheta_w = std::abs(cosTheta_w);
    Float sinTheta_w = SafeSqrt(1 - Sqr(cosTheta_w));

    // Compute $\cos\,\theta_\roman{\+b}$ for reference point
    Float cosTheta_b = BoundSubtendedDirections(bounds, p).cosTheta;
    Float sinTheta_b = SafeSqrt(1 - Sqr(cosTheta_b));

    // Compute $\cos\,\theta'$ and test against $\cos\,\theta_\roman{e}$
    Float sinTheta_o = SafeSqrt(1 - Sqr(cosTheta_o));
    Float cosTheta_x = cosSubClamped(sinTheta_w, cosTheta_w, sinTheta_o, cosTheta_o);
    Float sinTheta_x = sinSubClamped(sinTheta_w, cosTheta_w, sinTheta_o, cosTheta_o);
    Float cosThetap = cosSubClamped(sinTheta_x, cosTheta_x, sinTheta_b, cosTheta_b);
    if (cosThetap <= cosTheta_e)
        return 0;

    // Return final importance at reference point
    Float importance = phi * cosThetap / d2;
    DCHECK_GE(importance, -1e-3);
    // Account for $\cos\theta_\roman{i}$ in importance at surfaces
    if (n != Normal3f(0, 0, 0)) {
        Float cosTheta_i = AbsDot(wi, n);
        Float sinTheta_i = SafeSqrt(1 - Sqr(cosTheta_i));
        Float cosThetap_i = cosSubClamped(sinTheta_i, cosTheta_i, sinTheta_b, cosTheta_b);
        importance *= cosThetap_i;
    }

    importance = std::max<Float>(importance, 0);
    return importance;
}